

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<unsigned_int>::append(Array<unsigned_int> *this,Array<unsigned_int> *values)

{
  uint *puVar1;
  usize uVar2;
  uint *puVar3;
  uint *local_40;
  uint *src;
  uint *end;
  uint *item;
  usize valuesSize;
  usize size;
  Array<unsigned_int> *values_local;
  Array<unsigned_int> *this_local;
  
  puVar3 = (this->_end).item;
  puVar1 = (this->_begin).item;
  uVar2 = Array<unsigned_int>::size(values);
  reserve(this,((long)puVar3 - (long)puVar1 >> 2) + uVar2);
  end = (this->_end).item;
  puVar3 = end + uVar2;
  local_40 = (values->_begin).item;
  for (; end < puVar3; end = end + 1) {
    *end = *local_40;
    local_40 = local_40 + 1;
  }
  (this->_end).item = end;
  return;
}

Assistant:

void append(const Array& values)
  {
    usize size = _end.item - _begin.item;
    usize valuesSize = values.size();
    reserve(size + valuesSize);
    T* item = _end.item;
    for(T* end = item + valuesSize, *src = values._begin.item; item < end; ++item, ++src)
    {
#ifdef VERIFY
      VERIFY(new(item) T(*src) == item);
#else
      new(item) T(*src);
#endif
    }
    _end.item = item;
  }